

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O3

void __thiscall
icu_63::KeywordEnumeration::KeywordEnumeration
          (KeywordEnumeration *this,char *keys,int32_t keywordLen,int32_t currentIndex,
          UErrorCode *status)

{
  char *__dest;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeKeywordEnumeration_003b4d08;
  this->keywords = "";
  this->current = "";
  this->length = 0;
  (this->currUSKey).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003bc258;
  (this->currUSKey).fUnion.fStackFields.fLengthAndFlags = 2;
  if ((keywordLen != 0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (keys == (char *)0x0 || keywordLen < 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      __dest = (char *)uprv_malloc_63((ulong)(keywordLen + 1));
      this->keywords = __dest;
      if (__dest == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        memcpy(__dest,keys,(ulong)(uint)keywordLen);
        __dest[(uint)keywordLen] = '\0';
        this->current = __dest + currentIndex;
        this->length = keywordLen;
      }
    }
  }
  return;
}

Assistant:

KeywordEnumeration(const char *keys, int32_t keywordLen, int32_t currentIndex, UErrorCode &status)
        : keywords((char *)&fgClassID), current((char *)&fgClassID), length(0) {
        if(U_SUCCESS(status) && keywordLen != 0) {
            if(keys == NULL || keywordLen < 0) {
                status = U_ILLEGAL_ARGUMENT_ERROR;
            } else {
                keywords = (char *)uprv_malloc(keywordLen+1);
                if (keywords == NULL) {
                    status = U_MEMORY_ALLOCATION_ERROR;
                }
                else {
                    uprv_memcpy(keywords, keys, keywordLen);
                    keywords[keywordLen] = 0;
                    current = keywords + currentIndex;
                    length = keywordLen;
                }
            }
        }
    }